

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

QString * __thiscall
QTextHtmlExporter::toHtml(QString *__return_storage_ptr__,QTextHtmlExporter *this,ExportMode mode)

{
  QTextCharFormat *this_00;
  long lVar1;
  qreal qVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SpacingType SVar6;
  QTextFrame *pQVar7;
  QChar QVar8;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_90;
  undefined1 local_78 [16];
  QTextFrame *local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->html,(QLatin1String *)0x90);
  iVar5 = QTextDocumentPrivate::length(*(QTextDocumentPrivate **)&this->doc->field_0x8);
  QString::reserve(&this->html,(long)iVar5);
  this->fragmentMarkers = mode == ExportFragment;
  QString::append((QLatin1String *)this);
  lVar1 = *(long *)&this->doc->field_0x8;
  local_90.d = *(Data **)(lVar1 + 0x2a8);
  local_90.ptr = *(char16_t **)(lVar1 + 0x2b0);
  local_90.size = *(long *)(lVar1 + 0x2b8);
  if (local_90.d != (Data *)0x0) {
    LOCK();
    ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_90.size != 0) {
    QString::append((QLatin1String *)this);
    QString::append((QString *)this);
    QString::append((QLatin1String *)this);
  }
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  QString::append((QLatin1String *)this);
  this_00 = &this->defaultCharFormat;
  QVar8.ucs = (char16_t)this;
  if (mode != ExportEntireDocument) {
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_78);
    QTextFormat::operator=(&this_00->super_QTextFormat,(QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    goto LAB_004534a4;
  }
  QString::append((QLatin1String *)this);
  resolvedFontFamilies((QStringList *)local_78,this_00);
  emitFontFamily(this,(QStringList *)local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_78);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2001);
  if (bVar4) {
    QString::append((QLatin1String *)this);
    qVar2 = QTextCharFormat::fontPointSize(this_00);
    QString::number(qVar2,(char)(QArrayDataPointer<char16_t> *)local_78,0x67);
    QString::append((QString *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
LAB_0045319d:
    QString::append((QLatin1String *)this);
  }
  else {
    bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2009);
    if (bVar4) {
      QString::append((QLatin1String *)this);
      iVar5 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x2009);
      QString::number((int)(QArrayDataPointer<char16_t> *)local_78,iVar5);
      QString::append((QString *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      goto LAB_0045319d;
    }
  }
  QString::append((QLatin1String *)this);
  iVar5 = QTextCharFormat::fontWeight(this_00);
  QString::number((int)(QArrayDataPointer<char16_t> *)local_78,iVar5);
  QString::append((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
  QString::append(QVar8);
  QString::append((QLatin1String *)this);
  QTextCharFormat::fontItalic(this_00);
  QString::append((QLatin1String *)this);
  QString::append(QVar8);
  SVar6 = QTextCharFormat::fontLetterSpacingType(this_00);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x1fe1);
  if (bVar4) {
    if (SVar6 == PercentageSpacing) {
      qVar2 = QTextCharFormat::fontLetterSpacing(this_00);
      if ((qVar2 == 0.0) && (!NAN(qVar2))) goto LAB_004532e4;
    }
    QString::append((QLatin1String *)this);
    qVar2 = QTextCharFormat::fontLetterSpacing(this_00);
    if (SVar6 == PercentageSpacing) {
      qVar2 = qVar2 / 100.0 + -1.0;
    }
    QString::number(qVar2,(char)(QArrayDataPointer<char16_t> *)local_78,0x67);
    QString::append((QString *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    QString::append((QLatin1String *)this);
  }
LAB_004532e4:
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x1fe2);
  if (bVar4) {
    qVar2 = QTextCharFormat::fontWordSpacing(this_00);
    if ((qVar2 != 0.0) || (NAN(qVar2))) {
      QString::append((QLatin1String *)this);
      qVar2 = QTextCharFormat::fontWordSpacing(this_00);
      QString::number(qVar2,(char)(QArrayDataPointer<char16_t> *)local_78,0x67);
      QString::append((QString *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
      QString::append((QLatin1String *)this);
    }
  }
  local_68 = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  latin1.m_data = " text-decoration:";
  latin1.m_size = 0x11;
  QString::QString((QString *)local_78,latin1);
  bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2005);
  if (((bVar4) || (bVar4 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2023), bVar4)) &&
     (bVar4 = QTextCharFormat::fontUnderline(this_00), bVar4)) {
    QString::append((QLatin1String *)local_78);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  bVar3 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2006);
  if ((bVar3) && (bVar3 = QTextCharFormat::fontOverline(this_00), bVar3)) {
    QString::append((QLatin1String *)local_78);
    bVar4 = true;
  }
  bVar3 = QTextFormat::hasProperty(&this_00->super_QTextFormat,0x2007);
  if ((bVar3) && (bVar3 = QTextCharFormat::fontStrikeOut(this_00), bVar3)) {
    QString::append((QLatin1String *)local_78);
LAB_00453442:
    local_48._8_2_ = 0x3b;
    local_48._0_8_ = (QTextFormatPrivate *)local_78;
    ::operator+=(&this->html,(QStringBuilder<QString_&,_char16_t> *)local_48);
  }
  else if (bVar4) goto LAB_00453442;
  QString::append(QVar8);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::rootFrame(this->doc);
  QTextFrame::frameFormat((QTextFrame *)local_48);
  emitBackgroundAttribute(this,(QTextFormat *)local_48);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
LAB_004534a4:
  QString::append(QVar8);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::rootFrame(this->doc);
  QTextFrame::frameFormat((QTextFrame *)local_48);
  QTextFormat::clearProperty((QTextFormat *)local_48,0x820);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_58);
  QTextFrameFormat::setMargin
            ((QTextFrameFormat *)local_58,*(qreal *)(*(long *)&this->doc->field_0x8 + 0x310));
  bVar4 = QTextFormat::operator==((QTextFormat *)local_48,(QTextFormat *)local_58);
  if (bVar4) {
    pQVar7 = QTextDocument::rootFrame(this->doc);
    QTextFrame::begin((iterator *)local_78,pQVar7);
    emitFrame(this,(iterator *)local_78);
  }
  else {
    pQVar7 = QTextDocument::rootFrame(this->doc);
    emitTextFrame(this,pQVar7);
  }
  QString::append((QLatin1String *)this);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)this);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextHtmlExporter::toHtml(ExportMode mode)
{
    html = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0//EN\" "
           "\"http://www.w3.org/TR/REC-html40/strict.dtd\">\n"
           "<html><head><meta name=\"qrichtext\" content=\"1\" />"_L1;
    html.reserve(QTextDocumentPrivate::get(doc)->length());

    fragmentMarkers = (mode == ExportFragment);

    html += "<meta charset=\"utf-8\" />"_L1;

    QString title  = doc->metaInformation(QTextDocument::DocumentTitle);
    if (!title.isEmpty()) {
        html += "<title>"_L1;
        html += title;
        html += "</title>"_L1;
    }
    html += "<style type=\"text/css\">\n"_L1;
    html += "p, li { white-space: pre-wrap; }\n"_L1;
    html += "hr { height: 1px; border-width: 0; }\n"_L1;
    html += "li.unchecked::marker { content: \"\\2610\"; }\n"_L1;
    html += "li.checked::marker { content: \"\\2612\"; }\n"_L1;
    html += "</style>"_L1;
    html += "</head><body"_L1;

    if (mode == ExportEntireDocument) {
        html += " style=\""_L1;

        emitFontFamily(resolvedFontFamilies(defaultCharFormat));

        if (defaultCharFormat.hasProperty(QTextFormat::FontPointSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.fontPointSize());
            html += "pt;"_L1;
        } else if (defaultCharFormat.hasProperty(QTextFormat::FontPixelSize)) {
            html += " font-size:"_L1;
            html += QString::number(defaultCharFormat.intProperty(QTextFormat::FontPixelSize));
            html += "px;"_L1;
        }

        html += " font-weight:"_L1;
        html += QString::number(defaultCharFormat.fontWeight());
        html += u';';

        html += " font-style:"_L1;
        html += (defaultCharFormat.fontItalic() ? "italic"_L1 : "normal"_L1);
        html += u';';

        const bool percentSpacing = (defaultCharFormat.fontLetterSpacingType() == QFont::PercentageSpacing);
        if (defaultCharFormat.hasProperty(QTextFormat::FontLetterSpacing) &&
            (!percentSpacing || defaultCharFormat.fontLetterSpacing() != 0.0)) {
            html += " letter-spacing:"_L1;
            qreal value = defaultCharFormat.fontLetterSpacing();
            if (percentSpacing) // Map to em (100% == 0em)
                value = (value / 100) - 1;
            html += QString::number(value);
            html += percentSpacing ? "em;"_L1 : "px;"_L1;
        }

        if (defaultCharFormat.hasProperty(QTextFormat::FontWordSpacing) &&
            defaultCharFormat.fontWordSpacing() != 0.0) {
            html += " word-spacing:"_L1;
            html += QString::number(defaultCharFormat.fontWordSpacing());
            html += "px;"_L1;
        }

        QString decorationTag(" text-decoration:"_L1);
        bool atLeastOneDecorationSet = false;
        if (defaultCharFormat.hasProperty(QTextFormat::FontUnderline) || defaultCharFormat.hasProperty(QTextFormat::TextUnderlineStyle)) {
            if (defaultCharFormat.fontUnderline()) {
                decorationTag += " underline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontOverline)) {
            if (defaultCharFormat.fontOverline()) {
                decorationTag += " overline"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (defaultCharFormat.hasProperty(QTextFormat::FontStrikeOut)) {
            if (defaultCharFormat.fontStrikeOut()) {
                decorationTag += " line-through"_L1;
                atLeastOneDecorationSet = true;
            }
        }
        if (atLeastOneDecorationSet)
            html += decorationTag + u';';

        html += u'\"';

        const QTextFrameFormat fmt = doc->rootFrame()->frameFormat();
        emitBackgroundAttribute(fmt);

    } else {
        defaultCharFormat = QTextCharFormat();
    }
    html += u'>';

    QTextFrameFormat rootFmt = doc->rootFrame()->frameFormat();
    rootFmt.clearProperty(QTextFormat::BackgroundBrush);

    QTextFrameFormat defaultFmt;
    defaultFmt.setMargin(doc->documentMargin());

    if (rootFmt == defaultFmt)
        emitFrame(doc->rootFrame()->begin());
    else
        emitTextFrame(doc->rootFrame());

    html += "</body></html>"_L1;
    return html;
}